

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_lswx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 EA;
  TCGv_i32 arg3;
  TCGv_i32 arg4;
  TCGv_i32 arg5;
  TCGv_i32 t3;
  TCGv_i32 t2;
  TCGv_i32 t1;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->le_mode & 1U) == 0) {
    gen_set_access_type(ctx,0x20);
    EA = tcg_temp_new_i64(tcg_ctx_00);
    gen_addr_reg_index(ctx,EA);
    uVar1 = rD(ctx->opcode);
    arg3 = tcg_const_i32_ppc64(tcg_ctx_00,uVar1);
    uVar1 = rA(ctx->opcode);
    arg4 = tcg_const_i32_ppc64(tcg_ctx_00,uVar1);
    uVar1 = rB(ctx->opcode);
    arg5 = tcg_const_i32_ppc64(tcg_ctx_00,uVar1);
    gen_helper_lswx(tcg_ctx_00,tcg_ctx_00->cpu_env,EA,arg3,arg4,arg5);
    tcg_temp_free_i64(tcg_ctx_00,EA);
    tcg_temp_free_i32(tcg_ctx_00,arg3);
    tcg_temp_free_i32(tcg_ctx_00,arg4);
    tcg_temp_free_i32(tcg_ctx_00,arg5);
  }
  else {
    gen_align_no_le(ctx);
  }
  return;
}

Assistant:

static void gen_lswx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    TCGv_i32 t1, t2, t3;

    if (ctx->le_mode) {
        gen_align_no_le(ctx);
        return;
    }
    gen_set_access_type(ctx, ACCESS_INT);
    t0 = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, t0);
    t1 = tcg_const_i32(tcg_ctx, rD(ctx->opcode));
    t2 = tcg_const_i32(tcg_ctx, rA(ctx->opcode));
    t3 = tcg_const_i32(tcg_ctx, rB(ctx->opcode));
    gen_helper_lswx(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2, t3);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t2);
    tcg_temp_free_i32(tcg_ctx, t3);
}